

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O1

void av1_dr_prediction_z1_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int dx,int dy)

{
  undefined8 uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  undefined1 (*pauVar5) [16];
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  ushort uVar15;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar25;
  undefined1 auVar26 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ushort uVar37;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  undefined1 in_XMM9 [16];
  undefined1 auVar38 [16];
  ushort uVar45;
  undefined1 in_XMM10 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 local_438 [129];
  
  uVar12 = (ulong)(uint)bh;
  bVar3 = (byte)upsample_above;
  if (bw < 0x10) {
    if (bw == 4) {
      iVar6 = bh + 3 << (bVar3 & 0x1f);
      if (0 < bh) {
        auVar26 = pshufb(ZEXT116(above[iVar6]),(undefined1  [16])0x0);
        pauVar13 = (undefined1 (*) [16])local_438;
        uVar14 = 0;
        auVar27 = pmovsxbw(in_XMM3,0x1010101010101010);
        auVar28 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
        uVar11 = uVar12;
        uVar7 = dx;
        do {
          iVar9 = (int)uVar7 >> (6 - bVar3 & 0x1f);
          uVar8 = iVar6 - iVar9 >> (bVar3 & 0x1f);
          pauVar5 = pauVar13;
          uVar10 = uVar11;
          if ((int)uVar8 < 1) {
            do {
              *pauVar5 = auVar26;
              uVar10 = uVar10 - 1;
              pauVar5 = pauVar5 + 1;
            } while (uVar10 != 0);
          }
          else {
            uVar4 = 4;
            if ((int)uVar8 < 4) {
              uVar4 = uVar8;
            }
            auVar17 = *(undefined1 (*) [16])(above + iVar9);
            if (upsample_above == 0) {
              auVar29 = *(undefined1 (*) [16])(above + (long)iVar9 + 1);
              auVar33 = ZEXT416(uVar7 >> 1 & 0x1f);
              auVar33 = pshuflw(auVar33,auVar33,0);
              auVar33._4_4_ = auVar33._0_4_;
              auVar33._8_4_ = auVar33._0_4_;
              auVar33._12_4_ = auVar33._0_4_;
            }
            else {
              auVar17 = pshufb(auVar17,_DAT_00515ba0);
              auVar29 = auVar17 >> 0x40;
              auVar33 = pshuflw(ZEXT416(uVar7),ZEXT416(uVar7),0);
              auVar38._0_4_ = auVar33._0_4_;
              auVar38._4_4_ = auVar38._0_4_;
              auVar38._8_4_ = auVar38._0_4_;
              auVar38._12_4_ = auVar38._0_4_;
              auVar33 = psllw(auVar38,ZEXT416((uint)upsample_above));
              auVar46._0_2_ = auVar33._0_2_ >> 1;
              auVar46._2_2_ = auVar33._2_2_ >> 1;
              auVar46._4_2_ = auVar33._4_2_ >> 1;
              auVar46._6_2_ = auVar33._6_2_ >> 1;
              auVar46._8_2_ = auVar33._8_2_ >> 1;
              auVar46._10_2_ = auVar33._10_2_ >> 1;
              auVar46._12_2_ = auVar33._12_2_ >> 1;
              auVar46._14_2_ = auVar33._14_2_ >> 1;
              auVar33 = auVar46 & auVar28;
            }
            auVar38 = pmovzxbw(in_XMM9,auVar17);
            auVar47 = pmovzxbw(in_XMM10,auVar29);
            auVar46 = psllw(auVar38,5);
            in_XMM10._0_2_ = (auVar47._0_2_ - auVar38._0_2_) * auVar33._0_2_;
            in_XMM10._2_2_ = (auVar47._2_2_ - auVar38._2_2_) * auVar33._2_2_;
            in_XMM10._4_2_ = (auVar47._4_2_ - auVar38._4_2_) * auVar33._4_2_;
            in_XMM10._6_2_ = (auVar47._6_2_ - auVar38._6_2_) * auVar33._6_2_;
            in_XMM10._8_2_ = (auVar47._8_2_ - auVar38._8_2_) * auVar33._8_2_;
            in_XMM10._10_2_ = (auVar47._10_2_ - auVar38._10_2_) * auVar33._10_2_;
            in_XMM10._12_2_ = (auVar47._12_2_ - auVar38._12_2_) * auVar33._12_2_;
            in_XMM10._14_2_ = (auVar47._14_2_ - auVar38._14_2_) * auVar33._14_2_;
            uVar37 = (ushort)(auVar46._0_2_ + auVar27._0_2_ + in_XMM10._0_2_) >> 5;
            uVar39 = (ushort)(auVar46._2_2_ + auVar27._2_2_ + in_XMM10._2_2_) >> 5;
            uVar40 = (ushort)(auVar46._4_2_ + auVar27._4_2_ + in_XMM10._4_2_) >> 5;
            uVar41 = (ushort)(auVar46._6_2_ + auVar27._6_2_ + in_XMM10._6_2_) >> 5;
            uVar42 = (ushort)(auVar46._8_2_ + auVar27._8_2_ + in_XMM10._8_2_) >> 5;
            uVar43 = (ushort)(auVar46._10_2_ + auVar27._10_2_ + in_XMM10._10_2_) >> 5;
            uVar44 = (ushort)(auVar46._12_2_ + auVar27._12_2_ + in_XMM10._12_2_) >> 5;
            uVar45 = (ushort)(auVar46._14_2_ + auVar27._14_2_ + in_XMM10._14_2_) >> 5;
            auVar47._0_2_ = CONCAT11(0,auVar17[8]);
            auVar47[2] = auVar17[9];
            auVar47[3] = 0;
            auVar47[4] = auVar17[10];
            auVar47[5] = 0;
            auVar47[6] = auVar17[0xb];
            auVar47[7] = 0;
            auVar47[8] = auVar17[0xc];
            auVar47[9] = 0;
            auVar47[10] = auVar17[0xd];
            auVar47[0xb] = 0;
            auVar47[0xc] = auVar17[0xe];
            auVar47[0xd] = 0;
            auVar47[0xe] = auVar17[0xf];
            auVar47[0xf] = 0;
            auVar38 = psllw(auVar47,5);
            uVar15 = (ushort)(auVar38._0_2_ + auVar27._0_2_ +
                             (auVar29[8] - auVar47._0_2_) * auVar33._0_2_) >> 5;
            uVar19 = (ushort)(auVar38._2_2_ + auVar27._2_2_ +
                             ((ushort)auVar29[9] - (ushort)auVar17[9]) * auVar33._2_2_) >> 5;
            uVar20 = (ushort)(auVar38._4_2_ + auVar27._4_2_ +
                             ((ushort)auVar29[10] - (ushort)auVar17[10]) * auVar33._4_2_) >> 5;
            uVar21 = (ushort)(auVar38._6_2_ + auVar27._6_2_ +
                             ((ushort)auVar29[0xb] - (ushort)auVar17[0xb]) * auVar33._6_2_) >> 5;
            uVar22 = (ushort)(auVar38._8_2_ + auVar27._8_2_ +
                             ((ushort)auVar29[0xc] - (ushort)auVar17[0xc]) * auVar33._8_2_) >> 5;
            uVar23 = (ushort)(auVar38._10_2_ + auVar27._10_2_ +
                             ((ushort)auVar29[0xd] - (ushort)auVar17[0xd]) * auVar33._10_2_) >> 5;
            uVar24 = (ushort)(auVar38._12_2_ + auVar27._12_2_ +
                             ((ushort)auVar29[0xe] - (ushort)auVar17[0xe]) * auVar33._12_2_) >> 5;
            uVar25 = (ushort)(auVar38._14_2_ + auVar27._14_2_ +
                             ((ushort)auVar29[0xf] - (ushort)auVar17[0xf]) * auVar33._14_2_) >> 5;
            in_XMM9[1] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
            in_XMM9[0] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
            in_XMM9[2] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
            in_XMM9[3] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
            in_XMM9[4] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
            in_XMM9[5] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
            in_XMM9[6] = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
            in_XMM9[7] = (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
            in_XMM9[8] = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
            in_XMM9[9] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
            in_XMM9[10] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
            in_XMM9[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
            in_XMM9[0xc] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
            in_XMM9[0xd] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
            in_XMM9[0xe] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
            in_XMM9[0xf] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
            auVar17 = pblendvb(auVar26,in_XMM9,(undefined1  [16])Mask[0][uVar4]);
            *(undefined1 (*) [16])(local_438 + uVar14 * 2) = auVar17;
            uVar7 = uVar7 + dx;
          }
          if ((int)uVar8 < 1) break;
          uVar14 = uVar14 + 1;
          uVar11 = uVar11 - 1;
          pauVar13 = pauVar13 + 1;
        } while (uVar14 != uVar12);
        if (0 < bh) {
          lVar2 = 0;
          do {
            *(undefined4 *)dst = *(undefined4 *)((long)local_438 + lVar2);
            lVar2 = lVar2 + 0x10;
            dst = dst + stride;
          } while (uVar12 << 4 != lVar2);
        }
      }
    }
    else if ((bw == 8) && (iVar6 = bh + 7 << (bVar3 & 0x1f), 0 < bh)) {
      auVar26 = pshufb(ZEXT116(above[iVar6]),(undefined1  [16])0x0);
      pauVar13 = (undefined1 (*) [16])local_438;
      uVar14 = 0;
      auVar27 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar28 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar11 = uVar12;
      uVar7 = dx;
      do {
        iVar9 = (int)uVar7 >> (6 - bVar3 & 0x1f);
        uVar8 = iVar6 - iVar9 >> (bVar3 & 0x1f);
        pauVar5 = pauVar13;
        uVar10 = uVar11;
        if ((int)uVar8 < 1) {
          do {
            *pauVar5 = auVar26;
            uVar10 = uVar10 - 1;
            pauVar5 = pauVar5 + 1;
          } while (uVar10 != 0);
        }
        else {
          uVar4 = 8;
          if ((int)uVar8 < 8) {
            uVar4 = uVar8;
          }
          auVar17 = *(undefined1 (*) [16])(above + iVar9);
          if (upsample_above == 0) {
            auVar29 = *(undefined1 (*) [16])(above + (long)iVar9 + 1);
            auVar33 = ZEXT416(uVar7 >> 1 & 0x1f);
            auVar33 = pshuflw(auVar33,auVar33,0);
            auVar32._0_4_ = auVar33._0_4_;
            auVar32._4_4_ = auVar32._0_4_;
            auVar32._8_4_ = auVar32._0_4_;
            auVar32._12_4_ = auVar32._0_4_;
          }
          else {
            auVar17 = pshufb(auVar17,_DAT_00515ba0);
            auVar29 = auVar17 >> 0x40;
            auVar33 = pshuflw(ZEXT416(uVar7),ZEXT416(uVar7),0);
            auVar30._0_4_ = auVar33._0_4_;
            auVar30._4_4_ = auVar30._0_4_;
            auVar30._8_4_ = auVar30._0_4_;
            auVar30._12_4_ = auVar30._0_4_;
            auVar33 = psllw(auVar30,ZEXT416((uint)upsample_above));
            auVar31._0_2_ = auVar33._0_2_ >> 1;
            auVar31._2_2_ = auVar33._2_2_ >> 1;
            auVar31._4_2_ = auVar33._4_2_ >> 1;
            auVar31._6_2_ = auVar33._6_2_ >> 1;
            auVar31._8_2_ = auVar33._8_2_ >> 1;
            auVar31._10_2_ = auVar33._10_2_ >> 1;
            auVar31._12_2_ = auVar33._12_2_ >> 1;
            auVar31._14_2_ = auVar33._14_2_ >> 1;
            auVar32 = auVar31 & auVar28;
          }
          auVar33 = pmovzxbw(in_XMM9,auVar17);
          auVar46 = pmovzxbw(in_XMM10,auVar29);
          auVar38 = psllw(auVar33,5);
          in_XMM10._0_2_ = (auVar46._0_2_ - auVar33._0_2_) * auVar32._0_2_;
          in_XMM10._2_2_ = (auVar46._2_2_ - auVar33._2_2_) * auVar32._2_2_;
          in_XMM10._4_2_ = (auVar46._4_2_ - auVar33._4_2_) * auVar32._4_2_;
          in_XMM10._6_2_ = (auVar46._6_2_ - auVar33._6_2_) * auVar32._6_2_;
          in_XMM10._8_2_ = (auVar46._8_2_ - auVar33._8_2_) * auVar32._8_2_;
          in_XMM10._10_2_ = (auVar46._10_2_ - auVar33._10_2_) * auVar32._10_2_;
          in_XMM10._12_2_ = (auVar46._12_2_ - auVar33._12_2_) * auVar32._12_2_;
          in_XMM10._14_2_ = (auVar46._14_2_ - auVar33._14_2_) * auVar32._14_2_;
          uVar37 = (ushort)(auVar38._0_2_ + auVar27._0_2_ + in_XMM10._0_2_) >> 5;
          uVar39 = (ushort)(auVar38._2_2_ + auVar27._2_2_ + in_XMM10._2_2_) >> 5;
          uVar40 = (ushort)(auVar38._4_2_ + auVar27._4_2_ + in_XMM10._4_2_) >> 5;
          uVar41 = (ushort)(auVar38._6_2_ + auVar27._6_2_ + in_XMM10._6_2_) >> 5;
          uVar42 = (ushort)(auVar38._8_2_ + auVar27._8_2_ + in_XMM10._8_2_) >> 5;
          uVar43 = (ushort)(auVar38._10_2_ + auVar27._10_2_ + in_XMM10._10_2_) >> 5;
          uVar44 = (ushort)(auVar38._12_2_ + auVar27._12_2_ + in_XMM10._12_2_) >> 5;
          uVar45 = (ushort)(auVar38._14_2_ + auVar27._14_2_ + in_XMM10._14_2_) >> 5;
          auVar16._0_2_ = CONCAT11(0,auVar17[8]);
          auVar16[2] = auVar17[9];
          auVar16[3] = 0;
          auVar16[4] = auVar17[10];
          auVar16[5] = 0;
          auVar16[6] = auVar17[0xb];
          auVar16[7] = 0;
          auVar16[8] = auVar17[0xc];
          auVar16[9] = 0;
          auVar16[10] = auVar17[0xd];
          auVar16[0xb] = 0;
          auVar16[0xc] = auVar17[0xe];
          auVar16[0xd] = 0;
          auVar16[0xe] = auVar17[0xf];
          auVar16[0xf] = 0;
          auVar33 = psllw(auVar16,5);
          uVar15 = (ushort)(auVar33._0_2_ + auVar27._0_2_ +
                           (auVar29[8] - auVar16._0_2_) * auVar32._0_2_) >> 5;
          uVar19 = (ushort)(auVar33._2_2_ + auVar27._2_2_ +
                           ((ushort)auVar29[9] - (ushort)auVar17[9]) * auVar32._2_2_) >> 5;
          uVar20 = (ushort)(auVar33._4_2_ + auVar27._4_2_ +
                           ((ushort)auVar29[10] - (ushort)auVar17[10]) * auVar32._4_2_) >> 5;
          uVar21 = (ushort)(auVar33._6_2_ + auVar27._6_2_ +
                           ((ushort)auVar29[0xb] - (ushort)auVar17[0xb]) * auVar32._6_2_) >> 5;
          uVar22 = (ushort)(auVar33._8_2_ + auVar27._8_2_ +
                           ((ushort)auVar29[0xc] - (ushort)auVar17[0xc]) * auVar32._8_2_) >> 5;
          uVar23 = (ushort)(auVar33._10_2_ + auVar27._10_2_ +
                           ((ushort)auVar29[0xd] - (ushort)auVar17[0xd]) * auVar32._10_2_) >> 5;
          uVar24 = (ushort)(auVar33._12_2_ + auVar27._12_2_ +
                           ((ushort)auVar29[0xe] - (ushort)auVar17[0xe]) * auVar32._12_2_) >> 5;
          uVar25 = (ushort)(auVar33._14_2_ + auVar27._14_2_ +
                           ((ushort)auVar29[0xf] - (ushort)auVar17[0xf]) * auVar32._14_2_) >> 5;
          in_XMM9[1] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
          in_XMM9[0] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
          in_XMM9[2] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
          in_XMM9[3] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
          in_XMM9[4] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
          in_XMM9[5] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
          in_XMM9[6] = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
          in_XMM9[7] = (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
          in_XMM9[8] = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
          in_XMM9[9] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
          in_XMM9[10] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
          in_XMM9[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
          in_XMM9[0xc] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
          in_XMM9[0xd] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
          in_XMM9[0xe] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
          in_XMM9[0xf] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
          auVar17 = pblendvb(auVar26,in_XMM9,(undefined1  [16])Mask[0][uVar4]);
          *(undefined1 (*) [16])(local_438 + uVar14 * 2) = auVar17;
          uVar7 = uVar7 + dx;
        }
        if ((int)uVar8 < 1) break;
        uVar14 = uVar14 + 1;
        uVar11 = uVar11 - 1;
        pauVar13 = pauVar13 + 1;
      } while (uVar14 != uVar12);
      if (0 < bh) {
        lVar2 = 0;
        do {
          *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar2);
          lVar2 = lVar2 + 0x10;
          dst = dst + stride;
        } while (uVar12 << 4 != lVar2);
      }
    }
  }
  else if (bw == 0x10) {
    iVar6 = bh + 0xf << (bVar3 & 0x1f);
    if (0 < bh) {
      auVar26 = pshufb(ZEXT116(above[iVar6]),(undefined1  [16])0x0);
      pauVar13 = (undefined1 (*) [16])local_438;
      uVar14 = 0;
      auVar27 = pmovsxbw(in_XMM3,0x1010101010101010);
      auVar28 = pmovsxbw(in_XMM6,0x1f1f1f1f1f1f1f1f);
      uVar11 = uVar12;
      uVar7 = dx;
      do {
        iVar9 = (int)uVar7 >> (6 - bVar3 & 0x1f);
        uVar8 = iVar6 - iVar9 >> (bVar3 & 0x1f);
        pauVar5 = pauVar13;
        uVar10 = uVar11;
        if ((int)uVar8 < 1) {
          do {
            *pauVar5 = auVar26;
            uVar10 = uVar10 - 1;
            pauVar5 = pauVar5 + 1;
          } while (uVar10 != 0);
        }
        else {
          uVar4 = 0x10;
          if ((int)uVar8 < 0x10) {
            uVar4 = uVar8;
          }
          auVar17 = *(undefined1 (*) [16])(above + iVar9);
          if (upsample_above == 0) {
            auVar29 = *(undefined1 (*) [16])(above + (long)iVar9 + 1);
            auVar33 = ZEXT416(uVar7 >> 1 & 0x1f);
            auVar33 = pshuflw(auVar33,auVar33,0);
            auVar36._0_4_ = auVar33._0_4_;
            auVar36._4_4_ = auVar36._0_4_;
            auVar36._8_4_ = auVar36._0_4_;
            auVar36._12_4_ = auVar36._0_4_;
          }
          else {
            auVar17 = pshufb(auVar17,_DAT_00515ba0);
            auVar29 = auVar17 >> 0x40;
            auVar33 = pshuflw(ZEXT416(uVar7),ZEXT416(uVar7),0);
            auVar34._0_4_ = auVar33._0_4_;
            auVar34._4_4_ = auVar34._0_4_;
            auVar34._8_4_ = auVar34._0_4_;
            auVar34._12_4_ = auVar34._0_4_;
            auVar33 = psllw(auVar34,ZEXT416((uint)upsample_above));
            auVar35._0_2_ = auVar33._0_2_ >> 1;
            auVar35._2_2_ = auVar33._2_2_ >> 1;
            auVar35._4_2_ = auVar33._4_2_ >> 1;
            auVar35._6_2_ = auVar33._6_2_ >> 1;
            auVar35._8_2_ = auVar33._8_2_ >> 1;
            auVar35._10_2_ = auVar33._10_2_ >> 1;
            auVar35._12_2_ = auVar33._12_2_ >> 1;
            auVar35._14_2_ = auVar33._14_2_ >> 1;
            auVar36 = auVar35 & auVar28;
          }
          auVar33 = pmovzxbw(in_XMM9,auVar17);
          auVar46 = pmovzxbw(in_XMM10,auVar29);
          auVar38 = psllw(auVar33,5);
          in_XMM10._0_2_ = (auVar46._0_2_ - auVar33._0_2_) * auVar36._0_2_;
          in_XMM10._2_2_ = (auVar46._2_2_ - auVar33._2_2_) * auVar36._2_2_;
          in_XMM10._4_2_ = (auVar46._4_2_ - auVar33._4_2_) * auVar36._4_2_;
          in_XMM10._6_2_ = (auVar46._6_2_ - auVar33._6_2_) * auVar36._6_2_;
          in_XMM10._8_2_ = (auVar46._8_2_ - auVar33._8_2_) * auVar36._8_2_;
          in_XMM10._10_2_ = (auVar46._10_2_ - auVar33._10_2_) * auVar36._10_2_;
          in_XMM10._12_2_ = (auVar46._12_2_ - auVar33._12_2_) * auVar36._12_2_;
          in_XMM10._14_2_ = (auVar46._14_2_ - auVar33._14_2_) * auVar36._14_2_;
          uVar37 = (ushort)(auVar38._0_2_ + auVar27._0_2_ + in_XMM10._0_2_) >> 5;
          uVar39 = (ushort)(auVar38._2_2_ + auVar27._2_2_ + in_XMM10._2_2_) >> 5;
          uVar40 = (ushort)(auVar38._4_2_ + auVar27._4_2_ + in_XMM10._4_2_) >> 5;
          uVar41 = (ushort)(auVar38._6_2_ + auVar27._6_2_ + in_XMM10._6_2_) >> 5;
          uVar42 = (ushort)(auVar38._8_2_ + auVar27._8_2_ + in_XMM10._8_2_) >> 5;
          uVar43 = (ushort)(auVar38._10_2_ + auVar27._10_2_ + in_XMM10._10_2_) >> 5;
          uVar44 = (ushort)(auVar38._12_2_ + auVar27._12_2_ + in_XMM10._12_2_) >> 5;
          uVar45 = (ushort)(auVar38._14_2_ + auVar27._14_2_ + in_XMM10._14_2_) >> 5;
          auVar18._0_2_ = CONCAT11(0,auVar17[8]);
          auVar18[2] = auVar17[9];
          auVar18[3] = 0;
          auVar18[4] = auVar17[10];
          auVar18[5] = 0;
          auVar18[6] = auVar17[0xb];
          auVar18[7] = 0;
          auVar18[8] = auVar17[0xc];
          auVar18[9] = 0;
          auVar18[10] = auVar17[0xd];
          auVar18[0xb] = 0;
          auVar18[0xc] = auVar17[0xe];
          auVar18[0xd] = 0;
          auVar18[0xe] = auVar17[0xf];
          auVar18[0xf] = 0;
          auVar33 = psllw(auVar18,5);
          uVar15 = (ushort)(auVar33._0_2_ + auVar27._0_2_ +
                           (auVar29[8] - auVar18._0_2_) * auVar36._0_2_) >> 5;
          uVar19 = (ushort)(auVar33._2_2_ + auVar27._2_2_ +
                           ((ushort)auVar29[9] - (ushort)auVar17[9]) * auVar36._2_2_) >> 5;
          uVar20 = (ushort)(auVar33._4_2_ + auVar27._4_2_ +
                           ((ushort)auVar29[10] - (ushort)auVar17[10]) * auVar36._4_2_) >> 5;
          uVar21 = (ushort)(auVar33._6_2_ + auVar27._6_2_ +
                           ((ushort)auVar29[0xb] - (ushort)auVar17[0xb]) * auVar36._6_2_) >> 5;
          uVar22 = (ushort)(auVar33._8_2_ + auVar27._8_2_ +
                           ((ushort)auVar29[0xc] - (ushort)auVar17[0xc]) * auVar36._8_2_) >> 5;
          uVar23 = (ushort)(auVar33._10_2_ + auVar27._10_2_ +
                           ((ushort)auVar29[0xd] - (ushort)auVar17[0xd]) * auVar36._10_2_) >> 5;
          uVar24 = (ushort)(auVar33._12_2_ + auVar27._12_2_ +
                           ((ushort)auVar29[0xe] - (ushort)auVar17[0xe]) * auVar36._12_2_) >> 5;
          uVar25 = (ushort)(auVar33._14_2_ + auVar27._14_2_ +
                           ((ushort)auVar29[0xf] - (ushort)auVar17[0xf]) * auVar36._14_2_) >> 5;
          in_XMM9[1] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
          in_XMM9[0] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
          in_XMM9[2] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
          in_XMM9[3] = (uVar41 != 0) * (uVar41 < 0x100) * (char)uVar41 - (0xff < uVar41);
          in_XMM9[4] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
          in_XMM9[5] = (uVar43 != 0) * (uVar43 < 0x100) * (char)uVar43 - (0xff < uVar43);
          in_XMM9[6] = (uVar44 != 0) * (uVar44 < 0x100) * (char)uVar44 - (0xff < uVar44);
          in_XMM9[7] = (uVar45 != 0) * (uVar45 < 0x100) * (char)uVar45 - (0xff < uVar45);
          in_XMM9[8] = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
          in_XMM9[9] = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
          in_XMM9[10] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
          in_XMM9[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
          in_XMM9[0xc] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
          in_XMM9[0xd] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
          in_XMM9[0xe] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
          in_XMM9[0xf] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
          auVar17 = pblendvb(auVar26,in_XMM9,(undefined1  [16])Mask[0][uVar4]);
          *(undefined1 (*) [16])(local_438 + uVar14 * 2) = auVar17;
          uVar7 = uVar7 + dx;
        }
        if ((int)uVar8 < 1) break;
        uVar14 = uVar14 + 1;
        uVar11 = uVar11 - 1;
        pauVar13 = pauVar13 + 1;
      } while (uVar14 != uVar12);
      if (0 < bh) {
        lVar2 = 0;
        do {
          uVar1 = *(undefined8 *)((long)local_438 + lVar2 + 8);
          *(undefined8 *)dst = *(undefined8 *)((long)local_438 + lVar2);
          *(undefined8 *)(dst + 8) = uVar1;
          lVar2 = lVar2 + 0x10;
          dst = dst + stride;
        } while (uVar12 << 4 != lVar2);
      }
    }
  }
  else {
    if (bw == 0x20) {
      dr_prediction_z1_32xN_sse4_1(bh,dst,stride,above,dx,(int)left);
      return;
    }
    if (bw == 0x40) {
      dr_prediction_z1_64xN_sse4_1(bh,dst,stride,above,dx,(int)left);
      return;
    }
  }
  return;
}

Assistant:

void av1_dr_prediction_z1_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_above, int dx, int dy) {
  (void)left;
  (void)dy;
  switch (bw) {
    case 4:
      dr_prediction_z1_4xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 8:
      dr_prediction_z1_8xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 16:
      dr_prediction_z1_16xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 32:
      dr_prediction_z1_32xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    case 64:
      dr_prediction_z1_64xN_sse4_1(bh, dst, stride, above, upsample_above, dx);
      break;
    default: assert(0 && "Invalid block size");
  }
  return;
}